

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1d_cbs.c
# Opt level: O0

RK_S32 mpp_av1_lr_params(AV1Context *ctx,BitReadCtx_t *gb,AV1RawFrameHeader *current)

{
  RK_S32 RVar1;
  undefined1 local_50 [4];
  undefined1 local_4c [4];
  RK_U32 value_3;
  RK_U32 value_2;
  RK_U32 value_1;
  RK_U32 value;
  RK_S32 err;
  RK_S32 i;
  RK_S32 uses_chroma_lr;
  RK_S32 uses_lr;
  AV1RawSequenceHeader *seq;
  AV1RawFrameHeader *current_local;
  BitReadCtx_t *gb_local;
  AV1Context *ctx_local;
  
  _uses_chroma_lr = ctx->sequence_header;
  if (((ctx->all_lossless == 0) && (current->allow_intrabc == '\0')) &&
     (_uses_chroma_lr->enable_restoration != '\0')) {
    err = 0;
    i = 0;
    value = 0;
    seq = (AV1RawSequenceHeader *)current;
    current_local = (AV1RawFrameHeader *)gb;
    gb_local = &ctx->gb;
    while( true ) {
      if (*(int *)&gb_local[0x50].buf <= (int)value) {
        if (i != 0) {
          if (_uses_chroma_lr->use_128x128_superblock == '\0') {
            value_1 = mpp_av1_read_increment
                                ((BitReadCtx_t *)current_local,0,2,"lr_unit_shift",
                                 (RK_U32 *)local_4c);
            if ((int)value_1 < 0) {
              return value_1;
            }
            *(undefined1 *)((long)seq[1].operating_point_idc + 0x1d) = local_4c[0];
          }
          else {
            value_1 = mpp_av1_read_increment
                                ((BitReadCtx_t *)current_local,1,2,"lr_unit_shift",&value_3);
            if ((int)value_1 < 0) {
              return value_1;
            }
            *(undefined1 *)((long)seq[1].operating_point_idc + 0x1d) = (undefined1)value_3;
          }
          if ((((_uses_chroma_lr->color_config).subsampling_x == '\0') ||
              ((_uses_chroma_lr->color_config).subsampling_y == '\0')) || (err == 0)) {
            *(undefined1 *)(seq[1].operating_point_idc + 0xf) = 0;
          }
          else {
            RVar1 = mpp_av1_read_unsigned
                              ((BitReadCtx_t *)current_local,1,"lr_uv_shift",(RK_U32 *)local_50,0,1)
            ;
            if (RVar1 < 0) {
              return RVar1;
            }
            *(undefined1 *)(seq[1].operating_point_idc + 0xf) = local_50[0];
          }
        }
        return 0;
      }
      value_1 = mpp_av1_read_unsigned((BitReadCtx_t *)current_local,2,"lr_type[i]",&value_2,0,3);
      if ((int)value_1 < 0) break;
      *(char *)((long)seq[1].operating_point_idc + (long)(int)value + 0x1a) = (char)value_2;
      if ((*(char *)((long)seq[1].operating_point_idc + (long)(int)value + 0x1a) != '\0') &&
         (i = 1, 0 < (int)value)) {
        err = 1;
      }
      value = value + 1;
    }
    return value_1;
  }
  return 0;
}

Assistant:

static RK_S32 mpp_av1_lr_params(AV1Context *ctx, BitReadCtx_t *gb,
                                AV1RawFrameHeader *current)
{
    const AV1RawSequenceHeader *seq = ctx->sequence_header;
    RK_S32 uses_lr,  uses_chroma_lr;
    RK_S32 i, err;

    if (ctx->all_lossless || current->allow_intrabc ||
        !seq->enable_restoration) {
        return 0;
    }

    uses_lr = uses_chroma_lr = 0;
    for (i = 0; i < ctx->num_planes; i++) {
        fbs(2, lr_type[i], 1, i);

        if (current->lr_type[i] != AV1_RESTORE_NONE) {
            uses_lr = 1;
            if (i > 0)
                uses_chroma_lr = 1;
        }
    }

    if (uses_lr) {
        if (seq->use_128x128_superblock)
            increment(lr_unit_shift, 1, 2);
        else
            increment(lr_unit_shift, 0, 2);

        if (seq->color_config.subsampling_x &&
            seq->color_config.subsampling_y && uses_chroma_lr) {
            fb(1, lr_uv_shift);
        } else {
            infer(lr_uv_shift, 0);
        }
    }

    return 0;
}